

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3_log(int iErrCode,char *zFormat,...)

{
  _func_void_void_ptr_int_char_ptr *p_Var1;
  void *pvVar2;
  char in_AL;
  char *pcVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char zMsg [210];
  undefined1 auStack_1f8 [16];
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined4 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  sqlite3_str local_148;
  undefined1 *local_128;
  undefined1 *puStack_120;
  undefined1 *local_118;
  char local_108 [216];
  long local_30;
  
  if (in_AL != '\0') {
    local_1c8 = in_XMM0_Da;
    local_1b8 = in_XMM1_Qa;
    local_1a8 = in_XMM2_Qa;
    local_198 = in_XMM3_Qa;
    local_188 = in_XMM4_Qa;
    local_178 = in_XMM5_Qa;
    local_168 = in_XMM6_Qa;
    local_158 = in_XMM7_Qa;
  }
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_118 = &DAT_aaaaaaaaaaaaaaaa;
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
  local_1e8 = in_RDX;
  local_1e0 = in_RCX;
  local_1d8 = in_R8;
  local_1d0 = in_R9;
  if (sqlite3Config.xLog != (_func_void_void_ptr_int_char_ptr *)0x0) {
    puStack_120 = &stack0x00000008;
    local_128 = (undefined1 *)0x3000000010;
    local_148.nChar = 0xaaaaaaaa;
    local_148.accError = 0xaa;
    local_148.printfFlags = 0xaa;
    local_148._30_2_ = 0xaaaa;
    local_118 = auStack_1f8;
    memset(local_108,0xaa,0xd2);
    local_148.db = (sqlite3 *)0x0;
    local_148.nAlloc = 0xd2;
    local_148.mxAlloc = 0;
    local_148.nChar = 0;
    local_148.accError = '\0';
    local_148.printfFlags = '\0';
    local_148.zText = local_108;
    sqlite3_str_vappendf(&local_148,zFormat,(__va_list_tag *)&local_128);
    pvVar2 = sqlite3Config.pLogArg;
    p_Var1 = sqlite3Config.xLog;
    pcVar3 = sqlite3StrAccumFinish(&local_148);
    (*p_Var1)(pvVar2,iErrCode,pcVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API void sqlite3_log(int iErrCode, const char *zFormat, ...){
  va_list ap;                             /* Vararg list */
  if( sqlite3GlobalConfig.xLog ){
    va_start(ap, zFormat);
    renderLogMsg(iErrCode, zFormat, ap);
    va_end(ap);
  }
}